

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

PipelineResourceSignatureInternalDataType * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetInternalData
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  ImmutableSamplerAttribsVk *pIVar1;
  SHADER_TYPE SVar2;
  PipelineResourceSignatureInternalDataType *in_RDI;
  
  SVar2 = this->m_StaticResShaderStages;
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).ShaderStages = this->m_ShaderStages;
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).StaticResShaderStages = SVar2;
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).PipelineType = this->m_PipelineType;
  *(undefined8 *)
   ((long)&(in_RDI->
           super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
           ).pResourceAttribs + 4) = 0;
  *(undefined8 *)
   ((long)&(in_RDI->
           super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
           ).pImmutableSamplers + 4) = 0;
  *(undefined8 *)
   &(in_RDI->
    super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
    )._Padding = 0;
  *(undefined8 *)
   ((long)&(in_RDI->
           super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
           ).NumImmutableSamplers + 3) = 0;
  *(undefined4 *)
   (in_RDI->
   super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
   ).StaticResStageIndex._M_elems = *(undefined4 *)(this->m_StaticResStageIndex)._M_elems;
  *(undefined2 *)
   ((in_RDI->
    super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
    ).StaticResStageIndex._M_elems + 4) =
       *(undefined2 *)((this->m_StaticResStageIndex)._M_elems + 4);
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumResources =
       (this->
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       ).m_Desc.NumResources;
  pIVar1 = this->m_pImmutableSamplerAttribs;
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pResourceAttribs = this->m_pResourceAttribs;
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pImmutableSamplers = pIVar1;
  (in_RDI->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumImmutableSamplers =
       (this->
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       ).m_Desc.NumImmutableSamplers;
  return in_RDI;
}

Assistant:

PipelineResourceSignatureInternalDataType GetInternalData() const
    {
        PipelineResourceSignatureInternalDataType InternalData;

        InternalData.ShaderStages          = m_ShaderStages;
        InternalData.StaticResShaderStages = m_StaticResShaderStages;
        InternalData.PipelineType          = m_PipelineType;
        InternalData.StaticResStageIndex   = m_StaticResStageIndex;

        InternalData.pResourceAttribs     = m_pResourceAttribs;
        InternalData.NumResources         = this->m_Desc.NumResources;
        InternalData.pImmutableSamplers   = m_pImmutableSamplerAttribs;
        InternalData.NumImmutableSamplers = this->m_Desc.NumImmutableSamplers;

        return InternalData;
    }